

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  ReaderWriter *this;
  Descriptor *this_00;
  reference r;
  IReaderWriter *local_438;
  IReaderWriter *local_418;
  IDescriptor *local_408;
  undefined1 local_3d0 [8];
  Rect_<int> i;
  iterator __end1;
  iterator __begin1;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__range1;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_348;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_330 [4];
  ImageOutput local_2d0 [3];
  undefined1 local_270 [8];
  ImageOutput output;
  undefined1 local_238 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> optimized;
  undefined1 local_1c0 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> found;
  string local_1a0 [32];
  undefined1 local_180 [8];
  Mat sampleImage;
  undefined1 local_120 [8];
  ImageInput input;
  HumanDetector detect;
  Descriptor *des;
  ReaderWriter *readerWriter;
  char **argv_local;
  int argc_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Running demo for human detection");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this = (ReaderWriter *)operator_new(8);
  *this = (ReaderWriter)0x0;
  ReaderWriter::ReaderWriter(this);
  this_00 = (Descriptor *)operator_new(0xd0);
  *(undefined8 *)&this_00->field_0xc0 = 0;
  *(undefined8 *)&this_00->field_0xc8 = 0;
  *(undefined8 *)&this_00->field_0xb0 = 0;
  *(undefined8 *)&this_00->field_0xb8 = 0;
  *(undefined8 *)&this_00->field_0xa0 = 0;
  *(undefined8 *)&this_00->field_0xa8 = 0;
  *(undefined8 *)&this_00->field_0x90 = 0;
  *(undefined8 *)&this_00->field_0x98 = 0;
  *(undefined8 *)&this_00->field_0x80 = 0;
  *(undefined8 *)&this_00->field_0x88 = 0;
  *(undefined8 *)&this_00->field_0x70 = 0;
  *(undefined8 *)&this_00->field_0x78 = 0;
  *(undefined8 *)&this_00->field_0x60 = 0;
  *(undefined8 *)&this_00->field_0x68 = 0;
  *(undefined8 *)&this_00->field_0x50 = 0;
  *(undefined8 *)&this_00->field_0x58 = 0;
  *(undefined8 *)&this_00->field_0x40 = 0;
  *(undefined8 *)&this_00->field_0x48 = 0;
  *(undefined8 *)&this_00->field_0x30 = 0;
  *(undefined8 *)&this_00->field_0x38 = 0;
  *(undefined8 *)&this_00->field_0x20 = 0;
  *(undefined8 *)&this_00->field_0x28 = 0;
  *(undefined8 *)&this_00->field_0x10 = 0;
  *(undefined8 *)&this_00->field_0x18 = 0;
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)&this_00->descriptor = 0;
  Descriptor::Descriptor(this_00);
  HumanDetector::HumanDetector((HumanDetector *)&input.reader);
  local_408 = (IDescriptor *)0x0;
  if (this_00 != (Descriptor *)0x0) {
    local_408 = (IDescriptor *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x20));
  }
  HumanDetector::setDescriptor((HumanDetector *)&input.reader,local_408);
  ImageInput::ImageInput((ImageInput *)local_120);
  local_418 = (IReaderWriter *)0x0;
  if (this != (ReaderWriter *)0x0) {
    local_418 = (IReaderWriter *)(&this->field_0x0 + *(long *)((long)*this + -0x30));
  }
  ImageInput::setReader((ImageInput *)local_120,local_418);
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a0,pcVar1,
             (allocator *)
             ((long)&found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ImageInput::readImage((ImageInput *)local_180,(string *)local_120);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cv::Mat::Mat((Mat *)&optimized.
                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(Mat *)local_180);
  HumanDetector::detectHuman
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_1c0,
             (HumanDetector *)&input.reader,
             (Mat *)&optimized.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat((Mat *)&optimized.
                        super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&output.writer,
             (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_1c0);
  HumanDetector::improveBoundary
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_238,
             (HumanDetector *)&input.reader,
             (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&output.writer);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&output.writer);
  ImageOutput::ImageOutput((ImageOutput *)local_270);
  local_438 = (IReaderWriter *)0x0;
  if (this != (ReaderWriter *)0x0) {
    local_438 = (IReaderWriter *)(&this->field_0x0 + *(long *)((long)*this + -0x30));
  }
  ImageOutput::setWriter((ImageOutput *)local_270,local_438);
  cv::Mat::Mat((Mat *)local_330,(Mat *)local_180);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            (&local_348,(vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_238);
  ImageOutput::drawBoundary(local_2d0,(Mat *)local_270,local_330);
  cv::Mat::~Mat((Mat *)local_2d0);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector(&local_348);
  cv::Mat::~Mat((Mat *)local_330);
  poVar3 = std::operator<<((ostream *)&std::cout,"Press any key to exit view");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cv::Mat::Mat((Mat *)&__range1,(Mat *)local_180);
  ImageOutput::showImage((ImageOutput *)local_270,(Mat *)&__range1);
  cv::Mat::~Mat((Mat *)&__range1);
  cv::waitKey(0);
  poVar3 = std::operator<<((ostream *)&std::cout,"Real world coordinates of human are:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::begin
                     ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_238);
  i._8_8_ = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::end
                      ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_238);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                                *)&i.width);
    if (!bVar2) break;
    r = __gnu_cxx::
        __normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
        ::operator*(&__end1);
    cv::Rect_<int>::Rect_((Rect_<int> *)local_3d0,r);
    poVar3 = std::operator<<((ostream *)&std::cout,"(x, y) = (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3d0._0_4_);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3d0._4_4_);
    poVar3 = std::operator<<(poVar3,")");
    poVar3 = std::operator<<(poVar3,"of height");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i.y);
    poVar3 = std::operator<<(poVar3,"and width ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i.x);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
    ::operator++(&__end1);
  }
  ImageOutput::~ImageOutput((ImageOutput *)local_270);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_238);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_1c0);
  cv::Mat::~Mat((Mat *)local_180);
  ImageInput::~ImageInput((ImageInput *)local_120);
  HumanDetector::~HumanDetector((HumanDetector *)&input.reader);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::cout << "Running demo for human detection" << std::endl;
  auto readerWriter = new ReaderWriter();
  auto des = new Descriptor();
  HumanDetector detect;
  detect.setDescriptor(des);  // set actual implementation
  ImageInput input;
  input.setReader(readerWriter);  // set actual implementation
  cv::Mat sampleImage = input.readImage(argv[1]);  // take file name from user
  std::vector<cv::Rect> found = detect.detectHuman(sampleImage);
  std::vector<cv::Rect> optimized = detect.improveBoundary(found);
  ImageOutput output;
  output.setWriter(readerWriter);  // set actual implementation
  output.drawBoundary(sampleImage, optimized);
  std::cout << "Press any key to exit view" << std::endl;
  output.showImage(sampleImage);
  cv::waitKey();  // press any key to exit view
  std::cout << "Real world coordinates of human are:" << std::endl;
  for (auto i : optimized) {
    std::cout << "(x, y) = (" << i.x << ", " << i.y << ")" << "of height"
        << i.height << "and width " << i.width << std::endl;
  }
  return 0;
}